

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&,bool&,bool&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,bool *args_2,bool *args_3)

{
  string_view name;
  ParameterSymbol *pPVar1;
  BumpAllocator *in_R8;
  undefined1 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  ParameterSymbol *in_stack_00000008;
  SourceLocation in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pPVar1 = (ParameterSymbol *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = args_3;
  name._M_len = in_stack_00000018;
  slang::ast::ParameterSymbol::ParameterSymbol
            (in_stack_00000008,name,in_stack_00000010,(bool)unaff_retaddr_00,(bool)unaff_retaddr);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }